

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O1

int64_t getLastPCR(File *file,int bufferSize,int64_t fileSize)

{
  void *pvVar1;
  ulong uVar2;
  size_t in_RCX;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  lVar4 = fileSize - bufferSize;
  if (lVar4 < 1) {
    lVar4 = 0;
  }
  File::seek(file,lVar4,smBegin);
  pvVar1 = operator_new__((long)bufferSize);
  uVar2 = File::read(file,(int)pvVar1,(void *)(ulong)(uint)bufferSize,in_RCX);
  if ((int)(uint)uVar2 < 1) {
    uVar2 = 0xfffffffffffffffe;
  }
  else {
    pbVar3 = (byte *)((uVar2 & 0xffffffff) + (long)pvVar1);
    pbVar6 = pbVar3;
    if (2 < (uint)uVar2) {
      pbVar5 = (byte *)((long)pvVar1 + 2);
      do {
        lVar4 = 3;
        if (*pbVar5 < 2) {
          if (*pbVar5 == 0) {
            lVar4 = 1;
          }
          else if ((pbVar5[-2] == 0) && (pbVar5[-1] == 0)) {
            pbVar6 = pbVar5 + -2;
            break;
          }
        }
        pbVar5 = pbVar5 + lVar4;
      } while (pbVar5 < pbVar3);
    }
    uVar2 = 0xffffffffffffffff;
joined_r0x001c8f7a:
    if (pbVar6 <= pbVar3 + -0x11) {
      if (((byte)(pbVar6[3] + 0x41) < 0x31 || (pbVar6[3] & 0xbf) == 0xbd) &&
         ((char)pbVar6[7] < '\0')) {
        uVar2 = (ulong)((ushort)(*(ushort *)(pbVar6 + 0xc) << 8 | *(ushort *)(pbVar6 + 0xc) >> 8) >>
                       1) |
                (ulong)((pbVar6[0xb] & 0xfe) << 0xe | (uint)pbVar6[10] << 0x16) |
                (ulong)(pbVar6[9] >> 1 & 7) << 0x1e;
      }
      for (pbVar5 = pbVar6 + 6; pbVar6 = pbVar3, pbVar5 < pbVar3; pbVar5 = pbVar5 + lVar4) {
        lVar4 = 3;
        if (*pbVar5 < 2) {
          if (*pbVar5 == 0) {
            lVar4 = 1;
          }
          else if ((pbVar5[-2] == 0) && (pbVar5[-1] == 0)) {
            pbVar6 = pbVar5 + -2;
            break;
          }
        }
      }
      goto joined_r0x001c8f7a;
    }
    operator_delete__(pvVar1);
  }
  return uVar2;
}

Assistant:

int64_t getLastPCR(const File& file, const int bufferSize, const int64_t fileSize)
{
    file.seek(FFMAX(0, fileSize - bufferSize), File::SeekMethod::smBegin);
    const auto tmpBuffer = new uint8_t[bufferSize];
    const int len = file.read(tmpBuffer, bufferSize);
    if (len < 1)
        return -2;
    uint8_t* curPtr = tmpBuffer;
    uint8_t* bufEnd = tmpBuffer + len;
    int64_t lastPcrVal = -1;

    curPtr = MPEGHeader::findNextMarker(curPtr, bufEnd);
    while (curPtr <= bufEnd - 9 - 8)
    {
        const auto pesPacket = reinterpret_cast<PESPacket*>(curPtr);
        const uint8_t startcode = curPtr[3];
        if ((startcode >= 0xc0 && startcode <= 0xef) || (startcode == PES_PRIVATE_DATA1) || (startcode == PES_VC1_ID) ||
            (startcode == PES_PRIVATE_DATA2))
        {
            if ((pesPacket->flagsLo & 0x80) == 0x80)
                lastPcrVal = pesPacket->getPts();
        }
        curPtr = MPEGHeader::findNextMarker(curPtr + 4, bufEnd);
    }
    delete[] tmpBuffer;
    return lastPcrVal;
}